

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceGetRootDevice(ze_device_handle_t hDevice,ze_device_handle_t *phRootDevice)

{
  ze_device_handle_t p_Var1;
  ze_pfnDeviceGetRootDevice_t pfnGetRootDevice;
  ze_result_t result;
  ze_device_handle_t *phRootDevice_local;
  ze_device_handle_t hDevice_local;
  
  pfnGetRootDevice._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c2a8 == (code *)0x0) {
    p_Var1 = (ze_device_handle_t)context_t::get((context_t *)&context);
    *phRootDevice = p_Var1;
  }
  else {
    pfnGetRootDevice._4_4_ = (*DAT_0011c2a8)(hDevice,phRootDevice);
  }
  return pfnGetRootDevice._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetRootDevice(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        ze_device_handle_t* phRootDevice                ///< [in,out] parent root device.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetRootDevice = context.zeDdiTable.Device.pfnGetRootDevice;
        if( nullptr != pfnGetRootDevice )
        {
            result = pfnGetRootDevice( hDevice, phRootDevice );
        }
        else
        {
            // generic implementation
            *phRootDevice = reinterpret_cast<ze_device_handle_t>( context.get() );

        }

        return result;
    }